

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

Regexp * __thiscall
duckdb_re2::SimplifyWalker::ShortVisit(SimplifyWalker *this,Regexp *re,Regexp *parent_arg)

{
  Regexp *pRVar1;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"SimplifyWalker::ShortVisit called",0x21);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  pRVar1 = Regexp::Incref(re);
  return pRVar1;
}

Assistant:

Regexp* SimplifyWalker::ShortVisit(Regexp* re, Regexp* parent_arg) {
  // Should never be called: we use Walk(), not WalkExponential().
#ifndef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  LOG(DFATAL) << "SimplifyWalker::ShortVisit called";
#endif
  return re->Incref();
}